

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.hpp
# Opt level: O0

void __thiscall
pico_tree::
kd_tree<pico_tree::space_map<pico_tree::point_map<double,2ul>>,pico_tree::metric_l2_squared,int>::
search_nearest<pico_tree::internal::point_wrapper<pico_tree::point_map<double,2ul>>,pico_tree::internal::search_nn<pico_tree::neighbor<int,double>>>
          (void *param_1,
          search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::point_map<double,_2UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_double>_>,_int>
          *param_2,undefined8 param_3)

{
  search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::point_map<double,_2UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_double>_>,_int>
  *this;
  space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_> local_60;
  search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::point_map<double,_2UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_double>_>,_int>
  local_58;
  undefined8 local_20;
  void *local_18;
  search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::point_map<double,_2UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_double>_>,_int>
  *local_8;
  
  local_20 = param_3;
  local_18 = param_1;
  local_8 = param_2;
  internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_>::space_wrapper
            (&local_60,(space_type *)param_1);
  this = local_8;
  internal::
  search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::point_map<double,_2UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_double>_>,_int>
  ::search_nearest_euclidean
            (&local_58,local_60.space_,(undefined1 *)((long)&((node_type *)param_1)->data + 8),
             local_8,local_20);
  internal::
  search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::point_map<double,_2UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_double>_>,_int>
  ::operator()(this,(node_type *)param_1);
  return;
}

Assistant:

inline void search_nearest(
      PointWrapper_ point, Visitor_& visitor, euclidean_space_tag) const {
    internal::search_nearest_euclidean<
        space_wrapper_type,
        Metric_,
        PointWrapper_,
        Visitor_,
        index_type>(
        space_wrapper_type(space_), metric_, data_.indices, point, visitor)(
        data_.root_node);
  }